

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# move_suite.cpp
# Opt level: O0

void move_array_to_vector(void)

{
  back_insert_iterator<std::vector<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>_>
  __result;
  basic_variable<std::allocator<char>_> *pbVar1;
  initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> init;
  basic_variable<std::allocator<char>_> *local_418;
  basic_variable<std::allocator<char>_> *local_3f0;
  iterator local_3e0;
  iterator local_3c8;
  basic_variable<std::allocator<char>_> *local_3b0;
  basic_variable<std::allocator<char>_> *local_3a8;
  basic_variable<std::allocator<char>_> *local_3a0;
  basic_variable<std::allocator<char>_> local_398;
  basic_variable<std::allocator<char>_> local_368;
  basic_variable<std::allocator<char>_> local_338;
  basic_variable<std::allocator<char>_> local_308;
  basic_variable<std::allocator<char>_> local_2d8;
  basic_variable<std::allocator<char>_> local_2a8;
  basic_variable<std::allocator<char>_> local_278;
  undefined1 local_248 [24];
  variable expect;
  iterator local_1f8;
  iterator local_1e0;
  undefined1 local_1c8 [8];
  vector<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>
  result;
  basic_variable<std::allocator<char>_> local_198;
  basic_variable<std::allocator<char>_> local_168;
  basic_variable<std::allocator<char>_> local_138;
  basic_variable<std::allocator<char>_> local_108;
  basic_variable<std::allocator<char>_> local_d8;
  basic_variable<std::allocator<char>_> local_a8;
  basic_variable<std::allocator<char>_> local_78;
  undefined1 local_48 [24];
  variable data;
  
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>(&local_198,true);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(&local_168,2);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<double>(&local_138,3.0);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_108,"alpha");
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_d8,L"bravo");
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_a8,L"charlie");
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_78,L"delta");
  local_48._0_8_ = &local_198;
  local_48._8_8_ = 7;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_48 + 0x10),
             (initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> *)local_48);
  pbVar1 = &local_198;
  local_3f0 = (basic_variable<std::allocator<char>_> *)local_48;
  do {
    local_3f0 = local_3f0 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_3f0);
  } while (local_3f0 != pbVar1);
  std::
  vector<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>
  ::vector((vector<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>
            *)local_1c8);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_1e0,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_1f8,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  __result = std::
             back_inserter<std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>
                       ((vector<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>
                         *)local_1c8);
  expect.storage._40_8_ =
       std::
       move<trial::dynamic::basic_variable<std::allocator<char>>::iterator,std::back_insert_iterator<std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>>
                 (&local_1e0,&local_1f8,__result);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_1f8);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_1e0);
  local_3a0 = &local_398;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>(local_3a0,true);
  local_3a0 = &local_368;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_3a0,2);
  local_3a0 = &local_338;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<double>(local_3a0,3.0);
  local_3a0 = &local_308;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(local_3a0,"alpha");
  local_3a0 = &local_2d8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(local_3a0,L"bravo");
  local_3a0 = &local_2a8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(local_3a0,L"charlie");
  local_3a0 = &local_278;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(local_3a0,L"delta");
  local_248._0_8_ = &local_398;
  local_248._8_8_ = 7;
  init._M_len = (size_type)pbVar1;
  init._M_array = (iterator)0x7;
  trial::dynamic::basic_array<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_248 + 0x10),
             (basic_array<std::allocator<char>_> *)local_248._0_8_,init);
  local_418 = (basic_variable<std::allocator<char>_> *)local_248;
  do {
    local_418 = local_418 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_418);
  } while (local_418 != &local_398);
  local_3a8 = (basic_variable<std::allocator<char>_> *)
              std::
              vector<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>
              ::begin((vector<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>
                       *)local_1c8);
  local_3b0 = (basic_variable<std::allocator<char>_> *)
              std::
              vector<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>
              ::end((vector<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>
                     *)local_1c8);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_3c8,(basic_variable<std::allocator<char>_> *)(local_248 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_3e0,(basic_variable<std::allocator<char>_> *)(local_248 + 0x10));
  boost::detail::
  test_all_with_impl<std::ostream,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,trial::dynamic::basic_variable<std::allocator<char>>::iterator,std::equal_to<trial::dynamic::basic_variable<std::allocator<char>>>>
            (&std::cerr,
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/move_suite.cpp"
             ,0xb8,"void move_array_to_vector()",local_3a8,local_3b0,&local_3c8,&local_3e0);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_3e0);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_3c8);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_248 + 0x10));
  std::
  vector<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>
  ::~vector((vector<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>
             *)local_1c8);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  return;
}

Assistant:

void move_array_to_vector()
{
    variable data = { true, 2, 3.0, "alpha", L"bravo", u"charlie", U"delta" };
    std::vector<variable> result;
    std::move(data.begin(), data.end(), std::back_inserter(result));

    variable expect = array::make({ true, 2, 3.0, "alpha", L"bravo", u"charlie", U"delta" });
    TRIAL_PROTOCOL_TEST_ALL_WITH(result.begin(), result.end(),
                                 expect.begin(), expect.end(),
                                 std::equal_to<variable>());
}